

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O3

void rr::anon_unknown_19::makeSharedVerticeDistinct
               (VertexPacket **packet,
               set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_>
               *vertices,VertexPacketAllocator *vpalloc)

{
  _Rb_tree_header *p_Var1;
  VertexPacket *pVVar2;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  VertexPacket *pVVar5;
  long lVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  
  p_Var4 = (vertices->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(vertices->_M_t)._M_impl.super__Rb_tree_header;
    pVVar2 = *packet;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (*(VertexPacket **)(p_Var4 + 1) >= pVVar2) {
        p_Var7 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(VertexPacket **)(p_Var4 + 1) < pVVar2];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(VertexPacket **)(p_Var7 + 1) <= pVVar2)) {
      pVVar5 = VertexPacketAllocator::alloc(vpalloc);
      uVar3 = *(undefined8 *)(((*packet)->position).m_data + 2);
      *(undefined8 *)(pVVar5->position).m_data = *(undefined8 *)((*packet)->position).m_data;
      *(undefined8 *)((pVVar5->position).m_data + 2) = uVar3;
      pVVar2 = *packet;
      pVVar5->pointSize = pVVar2->pointSize;
      pVVar5->primitiveID = pVVar2->primitiveID;
      if (vpalloc->m_numberOfVertexOutputs != 0) {
        lVar6 = 0x2c;
        uVar8 = 0;
        do {
          pVVar2 = *packet;
          *(undefined4 *)((long)(pVVar5->position).m_data + lVar6 + -0x14) =
               *(undefined4 *)((long)(pVVar2->position).m_data + lVar6 + -0x14);
          *(undefined4 *)((long)(&pVVar5->position + -1) + lVar6) =
               *(undefined4 *)((long)(&pVVar2->position + -1) + lVar6);
          *(undefined4 *)((long)(pVVar5->position).m_data + lVar6 + -0xc) =
               *(undefined4 *)((long)(pVVar2->position).m_data + lVar6 + -0xc);
          *(undefined4 *)((long)(pVVar5->position).m_data + lVar6 + -8) =
               *(undefined4 *)((long)(pVVar2->position).m_data + lVar6 + -8);
          uVar8 = uVar8 + 1;
          lVar6 = lVar6 + 0x10;
        } while (uVar8 < vpalloc->m_numberOfVertexOutputs);
      }
      *packet = pVVar5;
      return;
    }
  }
  std::
  _Rb_tree<rr::VertexPacket*,rr::VertexPacket*,std::_Identity<rr::VertexPacket*>,std::less<void*>,std::allocator<rr::VertexPacket*>>
  ::_M_insert_unique<rr::VertexPacket*const&>
            ((_Rb_tree<rr::VertexPacket*,rr::VertexPacket*,std::_Identity<rr::VertexPacket*>,std::less<void*>,std::allocator<rr::VertexPacket*>>
              *)vertices,packet);
  return;
}

Assistant:

void makeSharedVerticeDistinct (VertexPacket*& packet, std::set<VertexPacket*, std::less<void*> >& vertices, VertexPacketAllocator& vpalloc)
{
	// distinct
	if (vertices.find(packet) == vertices.end())
	{
		vertices.insert(packet);
	}
	else
	{
		VertexPacket* newPacket = vpalloc.alloc();

		// copy packet output values
		newPacket->position		= packet->position;
		newPacket->pointSize	= packet->pointSize;
		newPacket->primitiveID	= packet->primitiveID;

		for (size_t outputNdx = 0; outputNdx < vpalloc.getNumVertexOutputs(); ++outputNdx)
			newPacket->outputs[outputNdx] = packet->outputs[outputNdx];

		// no need to insert new packet to "vertices" as newPacket is unique
		packet = newPacket;
	}
}